

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

void __thiscall
CfgNode::BlockData::addInstructions
          (BlockData *this,list<Instruction_*,_std::allocator<Instruction_*>_> *instrs)

{
  bool bVar1;
  reference ppIVar2;
  Instruction *instr;
  const_iterator __end1;
  const_iterator __begin1;
  list<Instruction_*,_std::allocator<Instruction_*>_> *__range1;
  list<Instruction_*,_std::allocator<Instruction_*>_> *instrs_local;
  BlockData *this_local;
  
  __end1 = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::begin(instrs);
  instr = (Instruction *)
          std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::end(instrs);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&instr);
    if (!bVar1) break;
    ppIVar2 = std::_List_const_iterator<Instruction_*>::operator*(&__end1);
    addInstruction(this,*ppIVar2);
    std::_List_const_iterator<Instruction_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void CfgNode::BlockData::addInstructions(const std::list<Instruction*>& instrs) {
	for (Instruction* instr : instrs)
		this->addInstruction(instr);
}